

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

void accept_new_connection(socket *listener,mg_context *ctx)

{
  undefined8 uVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  undefined4 local_a0;
  socklen_t local_9c;
  int on;
  socklen_t len;
  char src_addr [50];
  undefined1 local_58 [4];
  undefined1 local_54 [4];
  socket so;
  mg_context *ctx_local;
  socket *listener_local;
  
  local_9c = 0x1c;
  local_a0 = 1;
  so._56_8_ = ctx;
  memset(local_58,0,0x40);
  local_58 = (undefined1  [4])
             accept(listener->sock,(sockaddr *)((long)&so.lsa.sin6.sin6_addr.__in6_u + 0xc),
                    &local_9c);
  if (local_58 != (undefined1  [4])0xffffffff) {
    iVar2 = check_acl((mg_context *)so._56_8_,(usa *)((long)&so.lsa + 0x14));
    if (iVar2 == 1) {
      set_close_on_exec((int)local_58,(mg_connection *)0x0,(mg_context *)so._56_8_);
      so.rsa._20_1_ = listener->is_ssl;
      so.rsa._21_1_ = listener->ssl_redir;
      iVar2 = getsockname((int)local_58,(sockaddr *)local_54,&local_9c);
      uVar1 = so._56_8_;
      if (iVar2 != 0) {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        mg_cry_internal_wrap
                  ((mg_connection *)0x0,(mg_context *)uVar1,"accept_new_connection",0x4e12,
                   "%s: getsockname() failed: %s","accept_new_connection",pcVar4);
      }
      if (((local_54._0_2_ == 2) || (local_54._0_2_ == 10)) &&
         (iVar2 = setsockopt((int)local_58,1,9,&local_a0,4), uVar1 = so._56_8_, iVar2 != 0)) {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        mg_cry_internal_wrap
                  ((mg_connection *)0x0,(mg_context *)uVar1,"accept_new_connection",0x4e29,
                   "%s: setsockopt(SOL_SOCKET SO_KEEPALIVE) failed: %s","accept_new_connection",
                   pcVar4);
      }
      if (((*(long *)(so._56_8_ + 0x283c8) != 0) &&
          (iVar2 = strcmp(*(char **)(so._56_8_ + 0x283c8),"1"), iVar2 == 0)) &&
         (iVar2 = set_tcp_nodelay((socket *)local_58,1), uVar1 = so._56_8_, iVar2 != 0)) {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        mg_cry_internal_wrap
                  ((mg_connection *)0x0,(mg_context *)uVar1,"accept_new_connection",0x4e3c,
                   "%s: setsockopt(IPPROTO_TCP TCP_NODELAY) failed: %s","accept_new_connection",
                   pcVar4);
      }
      set_non_blocking_mode((SOCKET)local_58);
      so.rsa._22_1_ = 0;
      produce_socket((mg_context *)so._56_8_,(socket *)local_58);
    }
    else {
      sockaddr_to_string((char *)&on,0x32,(usa *)((long)&so.lsa + 0x14));
      mg_cry_internal_wrap
                ((mg_connection *)0x0,(mg_context *)so._56_8_,"accept_new_connection",0x4e06,
                 "%s: %s is not allowed to connect","accept_new_connection",&on);
      close((int)local_58);
    }
  }
  return;
}

Assistant:

static void
accept_new_connection(const struct socket *listener, struct mg_context *ctx)
{
	struct socket so;
	char src_addr[IP_ADDR_STR_LEN];
	socklen_t len = sizeof(so.rsa);
#if !defined(__ZEPHYR__)
	int on = 1;
#endif
	memset(&so, 0, sizeof(so));

	if ((so.sock = accept(listener->sock, &so.rsa.sa, &len))
	    == INVALID_SOCKET) {
	} else if (check_acl(ctx, &so.rsa) != 1) {
		sockaddr_to_string(src_addr, sizeof(src_addr), &so.rsa);
		mg_cry_ctx_internal(ctx,
		                    "%s: %s is not allowed to connect",
		                    __func__,
		                    src_addr);
		closesocket(so.sock);
	} else {
		/* Put so socket structure into the queue */
		DEBUG_TRACE("Accepted socket %d", (int)so.sock);
		set_close_on_exec(so.sock, NULL, ctx);
		so.is_ssl = listener->is_ssl;
		so.ssl_redir = listener->ssl_redir;
		if (getsockname(so.sock, &so.lsa.sa, &len) != 0) {
			mg_cry_ctx_internal(ctx,
			                    "%s: getsockname() failed: %s",
			                    __func__,
			                    strerror(ERRNO));
		}

#if !defined(__ZEPHYR__)
		if ((so.lsa.sa.sa_family == AF_INET)
		    || (so.lsa.sa.sa_family == AF_INET6)) {
			/* Set TCP keep-alive for TCP sockets (IPv4 and IPv6).
			 * This is needed because if HTTP-level keep-alive
			 * is enabled, and client resets the connection, server won't get
			 * TCP FIN or RST and will keep the connection open forever. With
			 * TCP keep-alive, next keep-alive handshake will figure out that
			 * the client is down and will close the server end.
			 * Thanks to Igor Klopov who suggested the patch. */
			if (setsockopt(so.sock,
			               SOL_SOCKET,
			               SO_KEEPALIVE,
			               (SOCK_OPT_TYPE)&on,
			               sizeof(on))
			    != 0) {
				mg_cry_ctx_internal(
				    ctx,
				    "%s: setsockopt(SOL_SOCKET SO_KEEPALIVE) failed: %s",
				    __func__,
				    strerror(ERRNO));
			}
		}
#endif

		/* Disable TCP Nagle's algorithm. Normally TCP packets are coalesced
		 * to effectively fill up the underlying IP packet payload and
		 * reduce the overhead of sending lots of small buffers. However
		 * this hurts the server's throughput (ie. operations per second)
		 * when HTTP 1.1 persistent connections are used and the responses
		 * are relatively small (eg. less than 1400 bytes).
		 */
		if ((ctx->dd.config[CONFIG_TCP_NODELAY] != NULL)
		    && (!strcmp(ctx->dd.config[CONFIG_TCP_NODELAY], "1"))) {
			if (set_tcp_nodelay(&so, 1) != 0) {
				mg_cry_ctx_internal(
				    ctx,
				    "%s: setsockopt(IPPROTO_TCP TCP_NODELAY) failed: %s",
				    __func__,
				    strerror(ERRNO));
			}
		}

		/* The "non blocking" property should already be
		 * inherited from the parent socket. Set it for
		 * non-compliant socket implementations. */
		set_non_blocking_mode(so.sock);

		so.in_use = 0;
		produce_socket(ctx, &so);
	}
}